

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

int_t * intCalloc(int_t n)

{
  int_t *__s;
  char msg [256];
  char acStack_118 [256];
  
  __s = (int_t *)malloc((long)n << 2);
  if (__s == (int_t *)0x0) {
    sprintf(acStack_118,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for buf in intCalloc()",
            0xb9,"/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/memory.c"
           );
    superlu_abort_and_exit(acStack_118);
  }
  if (0 < n) {
    memset(__s,0,(ulong)(uint)n << 2);
  }
  return __s;
}

Assistant:

int_t *intCalloc(int_t n)
{
    int_t *buf;
    register int_t i;
    buf = (int_t *) SUPERLU_MALLOC(n * sizeof(int_t));
    if ( !buf ) {
	ABORT("SUPERLU_MALLOC fails for buf in intCalloc()");
    }
    for (i = 0; i < n; ++i) buf[i] = 0;
    return (buf);
}